

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
* __thiscall
b_array::detach_item<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>
          (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           *__return_storage_ptr__,b_array *this,
          Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
          *data,size_t *size)

{
  pointer pcVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *pPVar2;
  undefined1 *index;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Keyword local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (data->data !=
      (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
       *)0x0) {
    pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             ::operator[]((Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                           *)this,(size_t)&data->data[-1].field_0x27);
    local_58 = &(__return_storage_ptr__->key).field_2;
    (__return_storage_ptr__->key)._M_dataplus._M_p = (pointer)local_58;
    pcVar1 = (pPVar2->key)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pPVar2->key)._M_string_length);
    __return_storage_ptr__->value = pPVar2->value;
    local_48 = 0;
    local_40[0] = 0;
    local_80[0] = local_70;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_80,local_40,local_40);
    local_60 = ZERO;
    pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             ::operator[]((Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                           *)this,(size_t)data->data);
    std::__cxx11::string::operator=((string *)pPVar2,(string *)local_80);
    pPVar2->value = local_60;
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    local_48 = 0;
    local_40[0] = 0;
    local_80[0] = local_70;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_80,local_40,local_40);
    local_60 = ZERO;
    index = &data->data[-1].field_0x27;
    data->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
                  *)index;
    pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             ::operator[]((Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                           *)this,(size_t)index);
    std::__cxx11::string::operator=((string *)pPVar2,(string *)local_80);
    pPVar2->value = local_60;
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x4c,
                "T b_array::detach_item(b_array::Array<T> &, size_t &) [T = Map::Pair<std::basic_string<char>, sql_parser::Keyword>]"
               );
}

Assistant:

T detach_item(b_array::Array<T>& data, size_t& size) {
    assert(size > 0);
    T item = data[size - 1];
    data[size] = T();
    data[--size] = T();
    return item;
}